

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeSorterListToPMA(SortSubtask *pTask,SorterList *pList)

{
  sqlite3 *db;
  long lVar1;
  SorterRecord *pSVar2;
  int iVar3;
  int iVar4;
  sqlite3_file *psVar5;
  SorterRecord *p;
  u8 aByte [10];
  PmaWriter local_78;
  uchar local_3a [10];
  
  db = pTask->pSorter->db;
  psVar5 = (pTask->file).pFd;
  if (psVar5 == (sqlite3_file *)0x0) {
    iVar3 = vdbeSorterOpenTempFile(db,0,&(pTask->file).pFd);
    if (iVar3 != 0) {
      return iVar3;
    }
    psVar5 = (pTask->file).pFd;
  }
  vdbeSorterExtendFile
            ((sqlite3 *)(ulong)(uint)db->nMaxSorterMmap,psVar5,
             (pTask->file).iEof + (long)pList->szPMA + 9);
  iVar3 = vdbeSorterSort(pTask,pList);
  if (iVar3 == 0) {
    psVar5 = (pTask->file).pFd;
    iVar3 = pTask->pSorter->pgsz;
    lVar1 = (pTask->file).iEof;
    local_78.iWriteOff = 0;
    local_78.pFd = (sqlite3_file *)0x0;
    local_78.nBuffer = 0;
    local_78.iBufStart = 0;
    local_78.iBufEnd = 0;
    local_78._28_4_ = 0;
    local_78.eFWErr = 0;
    local_78._4_4_ = 0;
    local_78.aBuffer = (u8 *)0x0;
    local_78.aBuffer = (u8 *)sqlite3Malloc((long)iVar3);
    if (local_78.aBuffer == (u8 *)0x0) {
      local_78.eFWErr = 7;
    }
    else {
      local_78.iWriteOff = lVar1 % (long)iVar3;
      iVar4 = (int)local_78.iWriteOff;
      local_78.iBufEnd = iVar4;
      local_78.iWriteOff = lVar1 - local_78.iWriteOff;
      local_78.iBufStart = iVar4;
      local_78.nBuffer = iVar3;
      local_78.pFd = psVar5;
    }
    pTask->nPMA = pTask->nPMA + 1;
    iVar3 = sqlite3PutVarint(local_3a,(long)pList->szPMA);
    vdbePmaWriteBlob(&local_78,local_3a,iVar3);
    if (pList->pList != (SorterRecord *)0x0) {
      p = pList->pList;
      do {
        pSVar2 = (p->u).pNext;
        iVar3 = sqlite3PutVarint(local_3a,(long)p->nVal);
        vdbePmaWriteBlob(&local_78,local_3a,iVar3);
        vdbePmaWriteBlob(&local_78,(u8 *)(p + 1),p->nVal);
        if (pList->aMemory == (u8 *)0x0) {
          sqlite3_free(p);
        }
        p = pSVar2;
      } while (pSVar2 != (SorterRecord *)0x0);
    }
    pList->pList = (SorterRecord *)0x0;
    iVar3 = vdbePmaWriterFinish(&local_78,&(pTask->file).iEof);
  }
  return iVar3;
}

Assistant:

static int vdbeSorterListToPMA(SortSubtask *pTask, SorterList *pList){
  sqlite3 *db = pTask->pSorter->db;
  int rc = SQLITE_OK;             /* Return code */
  PmaWriter writer;               /* Object used to write to the file */

#ifdef SQLITE_DEBUG
  /* Set iSz to the expected size of file pTask->file after writing the PMA. 
  ** This is used by an assert() statement at the end of this function.  */
  i64 iSz = pList->szPMA + sqlite3VarintLen(pList->szPMA) + pTask->file.iEof;
#endif

  vdbeSorterWorkDebug(pTask, "enter");
  memset(&writer, 0, sizeof(PmaWriter));
  assert( pList->szPMA>0 );

  /* If the first temporary PMA file has not been opened, open it now. */
  if( pTask->file.pFd==0 ){
    rc = vdbeSorterOpenTempFile(db, 0, &pTask->file.pFd);
    assert( rc!=SQLITE_OK || pTask->file.pFd );
    assert( pTask->file.iEof==0 );
    assert( pTask->nPMA==0 );
  }

  /* Try to get the file to memory map */
  if( rc==SQLITE_OK ){
    vdbeSorterExtendFile(db, pTask->file.pFd, pTask->file.iEof+pList->szPMA+9);
  }

  /* Sort the list */
  if( rc==SQLITE_OK ){
    rc = vdbeSorterSort(pTask, pList);
  }

  if( rc==SQLITE_OK ){
    SorterRecord *p;
    SorterRecord *pNext = 0;

    vdbePmaWriterInit(pTask->file.pFd, &writer, pTask->pSorter->pgsz,
                      pTask->file.iEof);
    pTask->nPMA++;
    vdbePmaWriteVarint(&writer, pList->szPMA);
    for(p=pList->pList; p; p=pNext){
      pNext = p->u.pNext;
      vdbePmaWriteVarint(&writer, p->nVal);
      vdbePmaWriteBlob(&writer, SRVAL(p), p->nVal);
      if( pList->aMemory==0 ) sqlite3_free(p);
    }
    pList->pList = p;
    rc = vdbePmaWriterFinish(&writer, &pTask->file.iEof);
  }

  vdbeSorterWorkDebug(pTask, "exit");
  assert( rc!=SQLITE_OK || pList->pList==0 );
  assert( rc!=SQLITE_OK || pTask->file.iEof==iSz );
  return rc;
}